

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O0

void __thiscall pbrt::semantic::PBRTInfo::PBRTInfo(PBRTInfo *this,SP *scene)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  void *this_00;
  element_type *peVar4;
  mapped_type *pmVar5;
  Counter *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  it;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2_1;
  shared_ptr<pbrt::Material> mat;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  matsUsedByType;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_fffffffffffffb38;
  Scene *in_stack_fffffffffffffb40;
  key_type *in_stack_fffffffffffffb78;
  allocator *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffbc8;
  string *name;
  Counter *in_stack_fffffffffffffbd0;
  Counter *this_01;
  string local_340 [32];
  int local_320;
  _Self local_318;
  _Self local_310;
  undefined1 *local_308;
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [32];
  __shared_ptr local_2b8 [16];
  _Self in_stack_fffffffffffffd58;
  _Self in_stack_fffffffffffffd60;
  undefined1 local_290 [55];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  undefined1 local_209 [40];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [80];
  
  Counter::Counter(in_RDI);
  Counter::Counter(in_RDI + 1);
  Counter::Counter(in_RDI + 2);
  Counter::Counter(in_RDI + 3);
  Counter::Counter(in_RDI + 4);
  Counter::Counter(in_RDI + 5);
  Counter::Counter(in_RDI + 6);
  Counter::Counter(in_RDI + 7);
  Counter::Counter(in_RDI + 8);
  Counter::Counter(in_RDI + 9);
  Counter::Counter(in_RDI + 10);
  Counter::Counter(in_RDI + 0xb);
  Counter::Counter(in_RDI + 0xc);
  Counter::Counter(in_RDI + 0xd);
  Counter::Counter(in_RDI + 0xe);
  Counter::Counter(in_RDI + 0xf);
  Counter::Counter(in_RDI + 0x10);
  std::
  set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
  ::set((set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
         *)0x10dad8);
  std::
  set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
  ::set((set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
         *)0x10daf4);
  std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10db01)
  ;
  std::shared_ptr<pbrt::Object>::shared_ptr
            ((shared_ptr<pbrt::Object> *)in_stack_fffffffffffffb40,
             (shared_ptr<pbrt::Object> *)in_stack_fffffffffffffb38);
  traverse((PBRTInfo *)in_stack_fffffffffffffd60._M_node,(SP *)in_stack_fffffffffffffd58._M_node);
  std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x10db41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"objects",&local_51);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"areaLights",&local_79);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"shapes",&local_a1);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"triangles",&local_c9);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"quads",&local_f1);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"disks",&local_119);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"spheres",&local_141);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"curves",&local_169);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"curve segments",&local_191);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"lights",&local_1b9);
  Counter::print(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  this_01 = in_RDI + 0xd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"point lights",&local_1e1);
  Counter::print(this_01,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  name = (string *)local_209;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_209 + 1),"spot lights",(allocator *)name);
  Counter::print(this_01,name);
  std::__cxx11::string::~string((string *)(local_209 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"distant lights",&local_231);
  Counter::print(this_01,name);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"infinite lights",&local_259);
  Counter::print(this_01,name);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  poVar2 = std::operator<<((ostream *)&std::cout,"total num materials ");
  sVar3 = std::
          set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
          ::size((set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
                  *)0x10e1fb);
  this_00 = (void *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x10e22f);
  std::
  set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
  ::begin((set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
           *)in_stack_fffffffffffffb38);
  std::
  set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
  ::end((set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
         *)in_stack_fffffffffffffb38);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffd60,(_Self *)&stack0xfffffffffffffd58);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::shared_ptr<pbrt::Material>_>::operator*
              ((_Rb_tree_const_iterator<std::shared_ptr<pbrt::Material>_> *)0x10e29a);
    std::shared_ptr<pbrt::Material>::shared_ptr
              ((shared_ptr<pbrt::Material> *)in_stack_fffffffffffffb40,
               (shared_ptr<pbrt::Material> *)in_stack_fffffffffffffb38);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_2b8);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<pbrt::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10e2cd);
      (**(peVar4->super_Entity)._vptr_Entity)(local_2d8);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      *pmVar5 = *pmVar5 + 1;
      std::__cxx11::string::~string(local_2d8);
    }
    else {
      in_stack_fffffffffffffb80 = &local_2f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"null",in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb78 =
           (key_type *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      *(int *)in_stack_fffffffffffffb78 = *(int *)in_stack_fffffffffffffb78 + 1;
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    }
    std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x10e85c);
    std::_Rb_tree_const_iterator<std::shared_ptr<pbrt::Material>_>::operator++
              ((_Rb_tree_const_iterator<std::shared_ptr<pbrt::Material>_> *)
               in_stack_fffffffffffffb40);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"material usage by type:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_308 = local_290;
  local_310._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)in_stack_fffffffffffffb38);
  local_318._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)in_stack_fffffffffffffb38);
  while( true ) {
    bVar1 = std::operator!=(&local_310,&local_318);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 *)0x10e912);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    poVar2 = std::operator<<((ostream *)&std::cout," - ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_320);
    poVar2 = std::operator<<(poVar2,"x\t");
    poVar2 = std::operator<<(poVar2,local_340);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)0x10e9a7);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)in_stack_fffffffffffffb40);
  }
  std::operator<<((ostream *)&std::cout,"scene bounds ");
  std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10ea1c)
  ;
  Scene::getBounds(in_stack_fffffffffffffb40);
  poVar2 = math::operator<<((ostream *)in_stack_fffffffffffffb40,(box3f *)in_stack_fffffffffffffb38)
  ;
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x10ea67);
  return;
}

Assistant:

PBRTInfo(Scene::SP scene)
      {
        traverse(scene->world);
        numObjects.print("objects");
        numAreaLights.print("areaLights");
        numShapes.print("shapes");
        numTriangles.print("triangles");
        numQuads.print("quads");
        numDisks.print("disks");
        numSpheres.print("spheres");
        numCurves.print("curves");
        numCurveSegments.print("curve segments");
        numLights.print("lights");
        numPointLights.print("point lights");
        numSpotLights.print("spot lights");
        numDistantLights.print("distant lights");
        numInfiniteLights.print("infinite lights");
        std::cout << "total num materials " << usedMaterials.size() << std::endl;
        std::map<std::string,int> matsUsedByType;
        for (auto mat : usedMaterials)
          if (mat)
            matsUsedByType[mat->toString()]++;
          else
            matsUsedByType["null"]++;
            
        std::cout << "material usage by type:" << std::endl;
        for (auto it : matsUsedByType)
          std::cout << " - " << it.second << "x\t" << it.first << std::endl;
        std::cout << "scene bounds " << scene->getBounds() << std::endl;
      }